

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

uint32_t __thiscall spvtools::opt::Pass::GetNullId(Pass *this,uint32_t type_id)

{
  IRContext *this_00;
  TypeManager *this_01;
  ConstantManager *this_02;
  bool bVar1;
  Analysis AVar2;
  uint32_t uVar3;
  Type *type;
  Constant *c;
  Instruction *this_03;
  IRContext *this_04;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  bVar1 = IsFloat(this,type_id,0x10);
  if (bVar1) {
    IRContext::AddCapability(this->context_,CapabilityFloat16);
  }
  this_00 = this->context_;
  AVar2 = this_00->valid_analyses_;
  this_04 = this_00;
  if (-1 < (short)AVar2) {
    IRContext::BuildTypeManager(this_00);
    this_04 = this->context_;
    AVar2 = this_04->valid_analyses_;
  }
  this_01 = (this_00->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar2 >> 0xe & 1) == 0) {
    IRContext::BuildConstantManager(this_04);
  }
  this_02 = (this_04->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  type = analysis::TypeManager::GetType(this_01,type_id);
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c = analysis::ConstantManager::GetConstant(this_02,type,&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  uVar3 = 0;
  this_03 = analysis::ConstantManager::GetDefiningInstruction
                      (this_02,c,type_id,(inst_iterator *)0x0);
  if (this_03->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(this_03,(uint)this_03->has_type_id_);
  }
  return uVar3;
}

Assistant:

uint32_t Pass::GetNullId(uint32_t type_id) {
  if (IsFloat(type_id, 16)) context()->AddCapability(spv::Capability::Float16);
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  const analysis::Type* type = type_mgr->GetType(type_id);
  const analysis::Constant* null_const = const_mgr->GetConstant(type, {});
  Instruction* null_inst =
      const_mgr->GetDefiningInstruction(null_const, type_id);
  return null_inst->result_id();
}